

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureQueuedLogonMessagesHelper::
~initiatorFixtureQueuedLogonMessagesHelper(initiatorFixtureQueuedLogonMessagesHelper *this)

{
  initiatorFixtureQueuedLogonMessagesHelper *this_local;
  
  ~initiatorFixtureQueuedLogonMessagesHelper(this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, QueuedLogonMessages)
{
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  createSession(1, 0, 31);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 2 );
  object->next(receivedLogon, UtcTimeStamp(), true);

  for( int i = 3; i <= 6; ++i )
  {
      object->next( createNewOrderSingle( "ISLD", "TW", i), UtcTimeStamp() );
  }
  CHECK_EQUAL( 1, object->getExpectedTargetNum() );
  CHECK_EQUAL( 1, toResendRequest );

  object->next( createNewOrderSingle( "ISLD", "TW", 1), UtcTimeStamp() );
  CHECK_EQUAL( 1, toResendRequest );
  CHECK_EQUAL( 7, object->getExpectedTargetNum() );
}